

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::read_pvd
               (istream *stream,vector<double,_std::allocator<double>_> *times_out,
               vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
               *pvtupaths_out)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> pvtupaths;
  vector<double,_std::allocator<double>_> times;
  Tag tag;
  string line;
  allocator local_139;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *local_138;
  vector<double,_std::allocator<double>_> *local_130;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> local_128;
  _Vector_base<double,_std::allocator<double>_> local_108;
  Tag local_e8;
  string local_90;
  key_type local_70;
  key_type local_50;
  
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  p_Var1 = &local_e8.attribs._M_t._M_impl.super__Rb_tree_header;
  local_138 = pvtupaths_out;
  local_130 = times_out;
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_90);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    local_e8.elem_name._M_dataplus._M_p = (pointer)&local_e8.elem_name.field_2;
    local_e8.elem_name._M_string_length = 0;
    local_e8.elem_name.field_2._M_local_buf[0] = '\0';
    local_e8.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_e8.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_e8.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_e8.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_e8.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    bVar2 = xml_lite::parse_tag(&local_90,&local_e8);
    if (bVar2) {
      bVar2 = std::operator!=(&local_e8.elem_name,"DataSet");
      if (!bVar2) {
        std::__cxx11::string::string((string *)&local_50,"timestep",&local_139);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8.attribs,&local_50);
        local_70._M_dataplus._M_p = (pointer)std::__cxx11::stod(pmVar4,(size_t *)0x0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  ((vector<double,_std::allocator<double>_> *)&local_108,(double *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_70,"file",&local_139);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&local_e8.attribs,&local_70);
        filesystem::path::path((path *)&local_50,pmVar4);
        std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::
        emplace_back<Omega_h::filesystem::path>(&local_128,(path *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
      }
    }
    xml_lite::Tag::~Tag(&local_e8);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::vector<double,_std::allocator<double>_>::operator=
            (local_130,(vector<double,_std::allocator<double>_> *)&local_108);
  std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::operator=
            (local_138,&local_128);
  std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::~vector
            (&local_128);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
  return;
}

Assistant:

void read_pvd(std::istream& stream, std::vector<Real>* times_out,
    std::vector<filesystem::path>* pvtupaths_out) {
  std::vector<Real> times;
  std::vector<filesystem::path> pvtupaths;
  for (std::string line; std::getline(stream, line);) {
    xml_lite::Tag tag;
    if (!xml_lite::parse_tag(line, &tag)) continue;
    if (tag.elem_name != "DataSet") continue;
    times.push_back(std::stod(tag.attribs["timestep"]));
    pvtupaths.push_back(tag.attribs["file"]);
  }
  *times_out = times;
  *pvtupaths_out = pvtupaths;
}